

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O1

void amrex::EB_set_covered_faces(Array<MultiFab_*,_3> *umac,Real val)

{
  double dVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Array<MultiFab_*,_3> *pAVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  int *piVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int i;
  long lVar14;
  int iVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  MFIter mfi;
  Box local_294;
  Box local_278;
  Box local_25c;
  Array<MultiFab_*,_3> *local_240;
  Real local_238;
  Array4<double> local_230;
  FabArray<amrex::EBCellFlagFab> *local_1f0;
  Array4<double> local_1e8;
  Array4<double> local_1a8;
  MultiCutFab *local_168;
  MultiCutFab *local_160;
  MultiCutFab *local_158;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  local_240 = umac;
  local_238 = val;
  lVar7 = __dynamic_cast((umac->_M_elems[0]->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                         _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                         &EBFArrayBoxFactory::typeinfo,0);
  if (lVar7 != 0) {
    EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar7 + 0xd8));
    local_1f0 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar7 + 0xd8));
    uVar2 = ((FabArrayBase *)local_240->_M_elems[0])->n_comp;
    uVar8 = (ulong)uVar2;
    MFIter::MFIter(&local_90,(FabArrayBase *)local_240->_M_elems[0],true);
    if (local_90.currentIndex < local_90.endIndex) {
      do {
        local_230.p = (double *)0x1;
        local_230.jstride._0_4_ = 0;
        MFIter::tilebox(&local_25c,&local_90,(IntVect *)&local_230);
        local_230.p = (double *)0x100000000;
        local_230.jstride._0_4_ = 0;
        MFIter::tilebox(&local_278,&local_90,(IntVect *)&local_230);
        local_230.p = (double *)0x0;
        local_230.jstride._0_4_ = 1;
        MFIter::tilebox(&local_294,&local_90,(IntVect *)&local_230);
        pAVar5 = local_240;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_230,&local_240->_M_elems[0]->super_FabArray<amrex::FArrayBox>,&local_90);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_1a8,&pAVar5->_M_elems[1]->super_FabArray<amrex::FArrayBox>,&local_90);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_1e8,&pAVar5->_M_elems[2]->super_FabArray<amrex::FArrayBox>,&local_90);
        auVar4 = _DAT_006979c0;
        auVar3 = _DAT_006979b0;
        piVar9 = &local_90.currentIndex;
        if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar9 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start + local_90.currentIndex;
        }
        iVar15 = *(int *)&((local_1f0->m_fabs_v).
                           super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[*piVar9]->
                          super_BaseFab<amrex::EBCellFlag>).field_0x44;
        if (iVar15 == 1) {
          MultiCutFab::const_array(&local_d0,local_168,&local_90);
          MultiCutFab::const_array(&local_110,local_160,&local_90);
          MultiCutFab::const_array(&local_150,local_158,&local_90);
          if (0 < (int)uVar2) {
            lVar7 = 0;
            uVar11 = 0;
            do {
              iVar15 = local_25c.smallend.vect[2];
              if (local_25c.smallend.vect[2] <= local_25c.bigend.vect[2]) {
                do {
                  if (local_25c.smallend.vect[1] <= local_25c.bigend.vect[1]) {
                    lVar12 = (long)local_d0.p +
                             ((long)local_25c.smallend.vect[1] - (long)local_d0.begin.y) *
                             local_d0.jstride * 8 +
                             ((long)iVar15 - (long)local_d0.begin.z) * local_d0.kstride * 8 +
                             (long)local_d0.begin.x * -8 + (long)local_25c.smallend.vect[0] * 8;
                    lVar13 = (long)local_25c.smallend.vect[1];
                    do {
                      if (local_25c.smallend.vect[0] <= local_25c.bigend.vect[0]) {
                        lVar14 = 0;
                        do {
                          dVar1 = *(double *)(lVar12 + lVar14 * 8);
                          if ((dVar1 == 0.0) && (!NAN(dVar1))) {
                            *(Real *)((long)local_230.p +
                                     lVar14 * 8 +
                                     local_230.nstride * lVar7 +
                                     ((long)iVar15 - (long)local_230.begin.z) * local_230.kstride *
                                     8 + (lVar13 - local_230.begin.y) *
                                         CONCAT44(local_230.jstride._4_4_,
                                                  (undefined4)local_230.jstride) * 8 +
                                     (long)local_230.begin.x * -8 +
                                     (long)local_25c.smallend.vect[0] * 8) = local_238;
                          }
                          lVar14 = lVar14 + 1;
                        } while ((local_25c.bigend.vect[0] - local_25c.smallend.vect[0]) + 1 !=
                                 (int)lVar14);
                      }
                      lVar13 = lVar13 + 1;
                      lVar12 = lVar12 + local_d0.jstride * 8;
                    } while (local_25c.bigend.vect[1] + 1 != (int)lVar13);
                  }
                  bVar16 = iVar15 != local_25c.bigend.vect[2];
                  iVar15 = iVar15 + 1;
                } while (bVar16);
              }
              uVar11 = uVar11 + 1;
              lVar7 = lVar7 + 8;
            } while (uVar11 != uVar8);
          }
          if (0 < (int)uVar2) {
            lVar7 = 0;
            uVar11 = 0;
            do {
              iVar15 = local_278.smallend.vect[2];
              if (local_278.smallend.vect[2] <= local_278.bigend.vect[2]) {
                do {
                  if (local_278.smallend.vect[1] <= local_278.bigend.vect[1]) {
                    lVar12 = (long)local_110.p +
                             ((long)local_278.smallend.vect[1] - (long)local_110.begin.y) *
                             local_110.jstride * 8 +
                             ((long)iVar15 - (long)local_110.begin.z) * local_110.kstride * 8 +
                             (long)local_110.begin.x * -8 + (long)local_278.smallend.vect[0] * 8;
                    lVar13 = (long)local_278.smallend.vect[1];
                    do {
                      if (local_278.smallend.vect[0] <= local_278.bigend.vect[0]) {
                        lVar14 = 0;
                        do {
                          dVar1 = *(double *)(lVar12 + lVar14 * 8);
                          if ((dVar1 == 0.0) && (!NAN(dVar1))) {
                            *(Real *)((long)local_1a8.p +
                                     lVar14 * 8 +
                                     local_1a8.nstride * lVar7 +
                                     ((long)iVar15 - (long)local_1a8.begin.z) * local_1a8.kstride *
                                     8 + (lVar13 - local_1a8.begin.y) * local_1a8.jstride * 8 +
                                     (long)local_1a8.begin.x * -8 +
                                     (long)local_278.smallend.vect[0] * 8) = local_238;
                          }
                          lVar14 = lVar14 + 1;
                        } while ((local_278.bigend.vect[0] - local_278.smallend.vect[0]) + 1 !=
                                 (int)lVar14);
                      }
                      lVar13 = lVar13 + 1;
                      lVar12 = lVar12 + local_110.jstride * 8;
                    } while (local_278.bigend.vect[1] + 1 != (int)lVar13);
                  }
                  bVar16 = iVar15 != local_278.bigend.vect[2];
                  iVar15 = iVar15 + 1;
                } while (bVar16);
              }
              uVar11 = uVar11 + 1;
              lVar7 = lVar7 + 8;
            } while (uVar11 != uVar8);
          }
          if (0 < (int)uVar2) {
            lVar7 = 0;
            uVar11 = 0;
            do {
              iVar15 = local_294.smallend.vect[2];
              if (local_294.smallend.vect[2] <= local_294.bigend.vect[2]) {
                do {
                  if (local_294.smallend.vect[1] <= local_294.bigend.vect[1]) {
                    lVar12 = (long)local_150.p +
                             ((long)local_294.smallend.vect[1] - (long)local_150.begin.y) *
                             local_150.jstride * 8 +
                             ((long)iVar15 - (long)local_150.begin.z) * local_150.kstride * 8 +
                             (long)local_150.begin.x * -8 + (long)local_294.smallend.vect[0] * 8;
                    lVar13 = (long)local_294.smallend.vect[1];
                    do {
                      if (local_294.smallend.vect[0] <= local_294.bigend.vect[0]) {
                        lVar14 = 0;
                        do {
                          dVar1 = *(double *)(lVar12 + lVar14 * 8);
                          if ((dVar1 == 0.0) && (!NAN(dVar1))) {
                            *(Real *)((long)local_1e8.p +
                                     lVar14 * 8 +
                                     local_1e8.nstride * lVar7 +
                                     ((long)iVar15 - (long)local_1e8.begin.z) * local_1e8.kstride *
                                     8 + (lVar13 - local_1e8.begin.y) * local_1e8.jstride * 8 +
                                     (long)local_1e8.begin.x * -8 +
                                     (long)local_294.smallend.vect[0] * 8) = local_238;
                          }
                          lVar14 = lVar14 + 1;
                        } while ((local_294.bigend.vect[0] - local_294.smallend.vect[0]) + 1 !=
                                 (int)lVar14);
                      }
                      lVar13 = lVar13 + 1;
                      lVar12 = lVar12 + local_150.jstride * 8;
                    } while (local_294.bigend.vect[1] + 1 != (int)lVar13);
                  }
                  bVar16 = iVar15 != local_294.bigend.vect[2];
                  iVar15 = iVar15 + 1;
                } while (bVar16);
              }
              uVar11 = uVar11 + 1;
              lVar7 = lVar7 + 8;
            } while (uVar11 != uVar8);
          }
        }
        else if (iVar15 == -1) {
          if (0 < (int)uVar2) {
            uVar6 = local_25c.bigend.vect[0] - local_25c.smallend.vect[0];
            auVar17._4_4_ = 0;
            auVar17._0_4_ = uVar6;
            auVar17._8_4_ = uVar6;
            auVar17._12_4_ = 0;
            auVar17 = auVar17 ^ _DAT_006979c0;
            lVar7 = 0;
            uVar11 = 0;
            do {
              iVar15 = local_25c.smallend.vect[2];
              if (local_25c.smallend.vect[2] <= local_25c.bigend.vect[2]) {
                do {
                  if (local_25c.smallend.vect[1] <= local_25c.bigend.vect[1]) {
                    lVar12 = CONCAT44(local_230.jstride._4_4_,(undefined4)local_230.jstride) * 8;
                    lVar14 = (long)local_230.p +
                             local_230.nstride * lVar7 +
                             ((long)local_25c.smallend.vect[1] - (long)local_230.begin.y) * lVar12 +
                             ((long)iVar15 - (long)local_230.begin.z) * local_230.kstride * 8 +
                             (long)local_230.begin.x * -8 + (long)local_25c.smallend.vect[0] * 8 + 8
                    ;
                    lVar13 = (long)local_25c.smallend.vect[1];
                    do {
                      if (local_25c.smallend.vect[0] <= local_25c.bigend.vect[0]) {
                        uVar10 = 0;
                        do {
                          auVar20._8_4_ = (int)uVar10;
                          auVar20._0_8_ = uVar10;
                          auVar20._12_4_ = (int)(uVar10 >> 0x20);
                          auVar20 = (auVar20 | auVar3) ^ auVar4;
                          if ((bool)(~(auVar17._4_4_ < auVar20._4_4_ ||
                                      auVar17._0_4_ < auVar20._0_4_ &&
                                      auVar20._4_4_ == auVar17._4_4_) & 1)) {
                            *(Real *)(lVar14 + -8 + uVar10 * 8) = local_238;
                          }
                          if (auVar20._12_4_ <= auVar17._12_4_ &&
                              (auVar20._8_4_ <= auVar17._8_4_ || auVar20._12_4_ != auVar17._12_4_))
                          {
                            *(Real *)(lVar14 + uVar10 * 8) = local_238;
                          }
                          uVar10 = uVar10 + 2;
                        } while (((ulong)uVar6 + 2 & 0x1fffffffe) != uVar10);
                      }
                      lVar13 = lVar13 + 1;
                      lVar14 = lVar14 + lVar12;
                    } while (local_25c.bigend.vect[1] + 1 != (int)lVar13);
                  }
                  bVar16 = iVar15 != local_25c.bigend.vect[2];
                  iVar15 = iVar15 + 1;
                } while (bVar16);
              }
              uVar11 = uVar11 + 1;
              lVar7 = lVar7 + 8;
            } while (uVar11 != uVar8);
          }
          if (0 < (int)uVar2) {
            uVar6 = local_278.bigend.vect[0] - local_278.smallend.vect[0];
            auVar18._4_4_ = 0;
            auVar18._0_4_ = uVar6;
            auVar18._8_4_ = uVar6;
            auVar18._12_4_ = 0;
            auVar18 = auVar18 ^ auVar4;
            lVar7 = 0;
            uVar11 = 0;
            do {
              iVar15 = local_278.smallend.vect[2];
              if (local_278.smallend.vect[2] <= local_278.bigend.vect[2]) {
                do {
                  if (local_278.smallend.vect[1] <= local_278.bigend.vect[1]) {
                    lVar12 = (long)local_1a8.p +
                             local_1a8.nstride * lVar7 +
                             ((long)local_278.smallend.vect[1] - (long)local_1a8.begin.y) *
                             local_1a8.jstride * 8 +
                             ((long)iVar15 - (long)local_1a8.begin.z) * local_1a8.kstride * 8 +
                             (long)local_1a8.begin.x * -8 + (long)local_278.smallend.vect[0] * 8 + 8
                    ;
                    lVar13 = (long)local_278.smallend.vect[1];
                    do {
                      if (local_278.smallend.vect[0] <= local_278.bigend.vect[0]) {
                        uVar10 = 0;
                        do {
                          auVar21._8_4_ = (int)uVar10;
                          auVar21._0_8_ = uVar10;
                          auVar21._12_4_ = (int)(uVar10 >> 0x20);
                          auVar17 = (auVar21 | auVar3) ^ auVar4;
                          if ((bool)(~(auVar18._4_4_ < auVar17._4_4_ ||
                                      auVar18._0_4_ < auVar17._0_4_ &&
                                      auVar17._4_4_ == auVar18._4_4_) & 1)) {
                            *(Real *)(lVar12 + -8 + uVar10 * 8) = local_238;
                          }
                          if (auVar17._12_4_ <= auVar18._12_4_ &&
                              (auVar17._8_4_ <= auVar18._8_4_ || auVar17._12_4_ != auVar18._12_4_))
                          {
                            *(Real *)(lVar12 + uVar10 * 8) = local_238;
                          }
                          uVar10 = uVar10 + 2;
                        } while (((ulong)uVar6 + 2 & 0x1fffffffe) != uVar10);
                      }
                      lVar13 = lVar13 + 1;
                      lVar12 = lVar12 + local_1a8.jstride * 8;
                    } while (local_278.bigend.vect[1] + 1 != (int)lVar13);
                  }
                  bVar16 = iVar15 != local_278.bigend.vect[2];
                  iVar15 = iVar15 + 1;
                } while (bVar16);
              }
              uVar11 = uVar11 + 1;
              lVar7 = lVar7 + 8;
            } while (uVar11 != uVar8);
          }
          if (0 < (int)uVar2) {
            uVar6 = local_294.bigend.vect[0] - local_294.smallend.vect[0];
            auVar19._4_4_ = 0;
            auVar19._0_4_ = uVar6;
            auVar19._8_4_ = uVar6;
            auVar19._12_4_ = 0;
            lVar7 = 0;
            uVar11 = 0;
            do {
              iVar15 = local_294.smallend.vect[2];
              if (local_294.smallend.vect[2] <= local_294.bigend.vect[2]) {
                do {
                  if (local_294.smallend.vect[1] <= local_294.bigend.vect[1]) {
                    lVar12 = (long)local_1e8.p +
                             local_1e8.nstride * lVar7 +
                             ((long)local_294.smallend.vect[1] - (long)local_1e8.begin.y) *
                             local_1e8.jstride * 8 +
                             ((long)iVar15 - (long)local_1e8.begin.z) * local_1e8.kstride * 8 +
                             (long)local_1e8.begin.x * -8 + (long)local_294.smallend.vect[0] * 8 + 8
                    ;
                    lVar13 = (long)local_294.smallend.vect[1];
                    do {
                      if (local_294.smallend.vect[0] <= local_294.bigend.vect[0]) {
                        uVar10 = 0;
                        do {
                          auVar22._8_4_ = (int)uVar10;
                          auVar22._0_8_ = uVar10;
                          auVar22._12_4_ = (int)(uVar10 >> 0x20);
                          auVar20 = auVar19 ^ auVar4;
                          auVar17 = (auVar22 | auVar3) ^ auVar4;
                          if ((bool)(~(auVar20._4_4_ < auVar17._4_4_ ||
                                      auVar20._0_4_ < auVar17._0_4_ &&
                                      auVar17._4_4_ == auVar20._4_4_) & 1)) {
                            *(Real *)(lVar12 + -8 + uVar10 * 8) = local_238;
                          }
                          if (auVar17._12_4_ <= auVar20._12_4_ &&
                              (auVar17._8_4_ <= auVar20._8_4_ || auVar17._12_4_ != auVar20._12_4_))
                          {
                            *(Real *)(lVar12 + uVar10 * 8) = local_238;
                          }
                          uVar10 = uVar10 + 2;
                        } while (((ulong)uVar6 + 2 & 0x1fffffffe) != uVar10);
                      }
                      lVar13 = lVar13 + 1;
                      lVar12 = lVar12 + local_1e8.jstride * 8;
                    } while (local_294.bigend.vect[1] + 1 != (int)lVar13);
                  }
                  bVar16 = iVar15 != local_294.bigend.vect[2];
                  iVar15 = iVar15 + 1;
                } while (bVar16);
              }
              uVar11 = uVar11 + 1;
              lVar7 = lVar7 + 8;
            } while (uVar11 != uVar8);
          }
        }
        MFIter::operator++(&local_90);
      } while (local_90.currentIndex < local_90.endIndex);
    }
    MFIter::~MFIter(&local_90);
  }
  return;
}

Assistant:

void
EB_set_covered_faces (const Array<MultiFab*,AMREX_SPACEDIM>& umac, Real val)
{
    const auto factory = dynamic_cast<EBFArrayBoxFactory const*>(&(umac[0]->Factory()));
    if (factory == nullptr) return;

    const auto& area = factory->getAreaFrac();
    const auto& flags = factory->getMultiEBCellFlagFab();
    const int ncomp = umac[0]->nComp();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(*umac[0],TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        AMREX_D_TERM(const Box& xbx = mfi.tilebox(IntVect::TheDimensionVector(0));,
                     const Box& ybx = mfi.tilebox(IntVect::TheDimensionVector(1));,
                     const Box& zbx = mfi.tilebox(IntVect::TheDimensionVector(2)));
        AMREX_D_TERM(Array4<Real> const& u = umac[0]->array(mfi);,
                     Array4<Real> const& v = umac[1]->array(mfi);,
                     Array4<Real> const& w = umac[2]->array(mfi));

        auto fabtyp = flags[mfi].getType();
        if (fabtyp == FabType::covered)
        {
            AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM (
                xbx, txbx,
                {
                    const auto lo = amrex::lbound(txbx);
                    const auto hi = amrex::ubound(txbx);
                    for (int n = 0; n < ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            u(i,j,k,n) = val;
                        }}}
                    }
                }
                ,ybx, tybx,
                {
                    const auto lo = amrex::lbound(tybx);
                    const auto hi = amrex::ubound(tybx);
                    for (int n = 0; n < ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            v(i,j,k,n) = val;
                        }}}
                    }
                }
                ,zbx, tzbx,
                {
                    const auto lo = amrex::lbound(tzbx);
                    const auto hi = amrex::ubound(tzbx);
                    for (int n = 0; n < ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            w(i,j,k,n) = val;
                        }}}
                    }
                }
            );
        }
        else if (fabtyp == FabType::singlevalued)
        {
            AMREX_D_TERM(Array4<Real const> const& ax = area[0]->const_array(mfi);,
                         Array4<Real const> const& ay = area[1]->const_array(mfi);,
                         Array4<Real const> const& az = area[2]->const_array(mfi));
            AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM (
                xbx, txbx,
                {
                    const auto lo = amrex::lbound(txbx);
                    const auto hi = amrex::ubound(txbx);
                    for (int n = 0; n < ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            if (ax(i,j,k) == 0.0) u(i,j,k,n) = val;
                        }}}
                    }
                }
                ,ybx, tybx,
                {
                    const auto lo = amrex::lbound(tybx);
                    const auto hi = amrex::ubound(tybx);
                    for (int n = 0; n < ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            if (ay(i,j,k) == 0.0) v(i,j,k,n) = val;
                        }}}
                    }
                }
                ,zbx, tzbx,
                {
                    const auto lo = amrex::lbound(tzbx);
                    const auto hi = amrex::ubound(tzbx);
                    for (int n = 0; n < ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            if (az(i,j,k) == 0.0) w(i,j,k,n) = val;
                        }}}
                    }
                }
            );
        }
    }
}